

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

FloatParts sqrt_float(FloatParts a,float_status *s,FloatFmt *p)

{
  _Bool _Var1;
  long lVar2;
  ulong uVar3;
  int local_6c;
  uint64_t t_frac;
  uint64_t q;
  int last_bit;
  int bit;
  uint64_t s_frac;
  uint64_t r_frac;
  uint64_t a_frac;
  FloatFmt *p_local;
  float_status *s_local;
  FloatParts a_local;
  undefined8 local_10;
  
  r_frac = a.frac;
  a_local.frac._0_4_ = a.exp;
  a_local.frac._4_1_ = a.cls;
  a_local.frac._5_1_ = a.sign;
  a_local.frac._6_2_ = a._14_2_;
  _Var1 = is_nan(a_local.frac._4_1_);
  if (_Var1) {
    join_0x00000010_0x00000000_ = return_nan(a,s);
  }
  else {
    unique0x100001b0 = a;
    if (a_local.frac._4_1_ != float_class_zero) {
      if (((undefined1  [16])a & (undefined1  [16])0x10000000000) == (undefined1  [16])0x0) {
        if (a_local.frac._4_1_ != float_class_inf) {
          if (a_local.frac._4_1_ != float_class_normal) {
            __assert_fail("a.cls == float_class_normal",
                          "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/fpu/softfloat.c"
                          ,0xc5f,
                          "FloatParts sqrt_float(FloatParts, float_status *, const FloatFmt *)");
          }
          if (((undefined1  [16])a & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            r_frac = r_frac >> 1;
          }
          s_frac = 0;
          _last_bit = 0;
          q._4_4_ = 0x3d;
          if (p->frac_shift + -4 < 1) {
            local_6c = 0;
          }
          else {
            local_6c = p->frac_shift + -4;
          }
          do {
            lVar2 = 1L << ((byte)q._4_4_ & 0x3f);
            uVar3 = _last_bit + lVar2;
            if (uVar3 <= r_frac) {
              _last_bit = uVar3 + lVar2;
              r_frac = r_frac - uVar3;
              s_frac = lVar2 + s_frac;
            }
            r_frac = r_frac << 1;
            q._4_4_ = q._4_4_ + -1;
          } while (local_6c <= q._4_4_);
          local_10._4_1_ = 2;
          local_10._0_4_ = (int)a_local.frac >> 1;
          local_10._5_1_ = a_local.frac._5_1_;
          local_10._6_2_ = a_local.frac._6_2_;
          a_local._8_8_ = s_frac * 2 + (long)(int)(uint)(r_frac != 0);
        }
      }
      else {
        s->float_exception_flags = s->float_exception_flags | 1;
        join_0x00000010_0x00000000_ = parts_default_nan(s);
      }
    }
  }
  return stack0xffffffffffffffe8;
}

Assistant:

static FloatParts sqrt_float(FloatParts a, float_status *s, const FloatFmt *p)
{
    uint64_t a_frac, r_frac, s_frac;
    int bit, last_bit;

    if (is_nan(a.cls)) {
        return return_nan(a, s);
    }
    if (a.cls == float_class_zero) {
        return a;  /* sqrt(+-0) = +-0 */
    }
    if (a.sign) {
        s->float_exception_flags |= float_flag_invalid;
        return parts_default_nan(s);
    }
    if (a.cls == float_class_inf) {
        return a;  /* sqrt(+inf) = +inf */
    }

    assert(a.cls == float_class_normal);

    /* We need two overflow bits at the top. Adding room for that is a
     * right shift. If the exponent is odd, we can discard the low bit
     * by multiplying the fraction by 2; that's a left shift. Combine
     * those and we shift right if the exponent is even.
     */
    a_frac = a.frac;
    if (!(a.exp & 1)) {
        a_frac >>= 1;
    }
    a.exp >>= 1;

    /* Bit-by-bit computation of sqrt.  */
    r_frac = 0;
    s_frac = 0;

    /* Iterate from implicit bit down to the 3 extra bits to compute a
     * properly rounded result. Remember we've inserted one more bit
     * at the top, so these positions are one less.
     */
    bit = DECOMPOSED_BINARY_POINT - 1;
    last_bit = MAX(p->frac_shift - 4, 0);
    do {
        uint64_t q = 1ULL << bit;
        uint64_t t_frac = s_frac + q;
        if (t_frac <= a_frac) {
            s_frac = t_frac + q;
            a_frac -= t_frac;
            r_frac += q;
        }
        a_frac <<= 1;
    } while (--bit >= last_bit);

    /* Undo the right shift done above. If there is any remaining
     * fraction, the result is inexact. Set the sticky bit.
     */
    a.frac = (r_frac << 1) + (a_frac != 0);

    return a;
}